

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O1

char * Abc_NodeConvertSopToMvSop(int nVars,Vec_Int_t *vSop0,Vec_Int_t *vSop1)

{
  uint uVar1;
  ulong __n;
  char *__s;
  char *pcVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  char cVar7;
  char *__size;
  ulong uVar6;
  
  __n = (ulong)(uint)nVars;
  if ((vSop0->nSize == 0) || (vSop1->nSize == 0)) {
    __s = (char *)malloc((long)(nVars + 3));
    if (0 < nVars) {
      memset(__s,0x2d,__n);
    }
    __s[nVars] = 0 < vSop1->nSize | 0x30;
    (__s + (long)nVars + 1)[0] = '\n';
    (__s + (long)nVars + 1)[1] = '\0';
  }
  else {
    __size = (char *)(long)((nVars + 2) * (vSop1->nSize + vSop0->nSize) + 1);
    __s = (char *)malloc((size_t)__size);
    pcVar2 = __s;
    if (0 < vSop0->nSize) {
      lVar4 = 0;
      do {
        if (0 < nVars) {
          uVar1 = vSop0->pArray[lVar4];
          bVar3 = 0;
          uVar6 = __n;
          do {
            switch(uVar1 >> (bVar3 & 0x1f) & 3) {
            case 0:
              cVar7 = '-';
              break;
            case 1:
              cVar7 = '0';
              break;
            case 2:
              cVar7 = '1';
              break;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                            ,0x42f,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)")
              ;
            }
            *pcVar2 = cVar7;
            pcVar2 = pcVar2 + 1;
            bVar3 = bVar3 + 2;
            uVar5 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
        pcVar2[0] = '0';
        pcVar2[1] = '\n';
        pcVar2 = pcVar2 + 2;
        lVar4 = lVar4 + 1;
      } while (lVar4 < vSop0->nSize);
    }
    if (0 < vSop1->nSize) {
      lVar4 = 0;
      do {
        if (0 < nVars) {
          uVar1 = vSop1->pArray[lVar4];
          bVar3 = 0;
          uVar6 = __n;
          do {
            switch(uVar1 >> (bVar3 & 0x1f) & 3) {
            case 0:
              cVar7 = '-';
              break;
            case 1:
              cVar7 = '0';
              break;
            case 2:
              cVar7 = '1';
              break;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                            ,0x441,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)")
              ;
            }
            *pcVar2 = cVar7;
            pcVar2 = pcVar2 + 1;
            bVar3 = bVar3 + 2;
            uVar5 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
        pcVar2[0] = '1';
        pcVar2[1] = '\n';
        pcVar2 = pcVar2 + 2;
        lVar4 = lVar4 + 1;
      } while (lVar4 < vSop1->nSize);
    }
    *pcVar2 = '\0';
    if (pcVar2 + (1 - (long)__s) != __size) {
      __assert_fail("pCur - pMvSop == nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x447,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)");
    }
  }
  return __s;
}

Assistant:

char * Abc_NodeConvertSopToMvSop( int nVars, Vec_Int_t * vSop0, Vec_Int_t * vSop1 )
{
    char * pMvSop, * pCur;
    unsigned uCube;
    int nCubes, nSize, Value, i, k;
    // consider the case of the constant node
    if ( Vec_IntSize(vSop0) == 0 || Vec_IntSize(vSop1) == 0 )
    {
        // (temporary) create a tautology cube
        pMvSop = ABC_ALLOC( char, nVars + 3 );
        for ( k = 0; k < nVars; k++ )
            pMvSop[k] = '-';
        pMvSop[nVars] = '0' + (int)(Vec_IntSize(vSop1) > 0);
        pMvSop[nVars+1] = '\n';
        pMvSop[nVars+2] = 0;
        return pMvSop;
    }
    // find the total number of cubes
    nCubes = Vec_IntSize(vSop0) + Vec_IntSize(vSop1);
    // find the size of the MVSOP represented as a C-string
    // (each cube has nVars variables + one output literal + end-of-line,
    // and the string is zero-terminated)
    nSize = nCubes * (nVars + 2) + 1; 
    // allocate memory
    pMvSop = pCur = ABC_ALLOC( char, nSize );
    // fill in the negative polarity cubes
    Vec_IntForEachEntry( vSop0, uCube, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Value = (uCube >> (2*k)) & 3;
            if ( Value == 1 )
                *pCur++ = '0';
            else if ( Value == 2 )
                *pCur++ = '1';
            else if ( Value == 0 )
                *pCur++ = '-';
            else
                assert( 0 );
        }
        *pCur++ = '0';
        *pCur++ = '\n';
    }
    // fill in the positive polarity cubes
    Vec_IntForEachEntry( vSop1, uCube, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Value = (uCube >> (2*k)) & 3;
            if ( Value == 1 )
                *pCur++ = '0';
            else if ( Value == 2 )
                *pCur++ = '1';
            else if ( Value == 0 )
                *pCur++ = '-';
            else
                assert( 0 );
        }
        *pCur++ = '1';
        *pCur++ = '\n';
    }
    *pCur++ = 0;
    assert( pCur - pMvSop == nSize );
    return pMvSop;
}